

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::VertexBuffersTest::PrepareVAO
          (VertexBuffersTest *this,bool use_multiple_buffers_function)

{
  GLuint *pGVar1;
  GLuint *pGVar2;
  ostringstream *poVar3;
  code *pcVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  Enum<int,_2UL> local_1f0;
  GLint array_data_1 [2];
  GLsizei stride;
  GLintptr offset;
  GLint array_data_0 [4];
  undefined1 local_1b0 [384];
  long lVar8;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  pGVar1 = &this->m_vao;
  (**(code **)(lVar8 + 0x708))(1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x5ce);
  (**(code **)(lVar8 + 0xd8))(this->m_vao);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x5d1);
  array_data_0[0] = 0;
  array_data_0[1] = 2;
  array_data_0[2] = 1;
  array_data_0[3] = 3;
  pGVar2 = &this->m_bo_array_0;
  (**(code **)(lVar8 + 0x6c8))(1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x5d7);
  (**(code **)(lVar8 + 0x40))(0x8892,this->m_bo_array_0);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x5da);
  (**(code **)(lVar8 + 0x150))(0x8892,0x10,array_data_0,0x88e4);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x5dd);
  pcVar4 = *(code **)(lVar8 + 0x1898);
  uVar7 = (**(code **)(lVar8 + 0x780))(this->m_po,"a_0");
  (*pcVar4)(uVar7,0);
  pcVar4 = *(code **)(lVar8 + 0x1898);
  uVar7 = (**(code **)(lVar8 + 0x780))(this->m_po,"a_1");
  (*pcVar4)(uVar7,1);
  pcVar4 = *(code **)(lVar8 + 0x1950);
  uVar7 = (**(code **)(lVar8 + 0x780))(this->m_po,"a_0");
  (*pcVar4)(uVar7,1,0x1404,0);
  pcVar4 = *(code **)(lVar8 + 0x1950);
  uVar7 = (**(code **)(lVar8 + 0x780))(this->m_po,"a_1");
  (*pcVar4)(uVar7,1,0x1404,0);
  if ((int)CONCAT71(in_register_00000031,use_multiple_buffers_function) == 0) {
    (**(code **)(lVar8 + 0x1760))(*pGVar1,0,*pGVar2,0,8);
    iVar5 = (**(code **)(lVar8 + 0x800))();
    if (iVar5 != 0) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar3 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::operator<<((ostream *)poVar3,"VertexArrayVertexBuffer has unexpectedly generated ");
      local_1f0.m_getName = glu::getErrorName;
      local_1f0.m_value = iVar5;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar3);
      std::operator<<((ostream *)poVar3,"error. Test fails.\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00b14889;
    }
    (**(code **)(lVar8 + 0x1760))(*pGVar1,1,*pGVar2,4,8);
    local_1f0.m_value = (**(code **)(lVar8 + 0x800))();
    if (local_1f0.m_value != 0) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar3 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::operator<<((ostream *)poVar3,"VertexArrayVertexBuffer has unexpectedly generated ");
      local_1f0.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar3);
      std::operator<<((ostream *)poVar3,"error. Test fails.\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00b14889;
    }
  }
  else {
    array_data_1[1] = *pGVar2;
    array_data_1[0] = *pGVar2;
    (**(code **)(lVar8 + 0x1768))(*pGVar1,0,2,array_data_1,PrepareVAO::offsets,PrepareVAO::strides);
    iVar5 = (**(code **)(lVar8 + 0x800))();
    if (iVar5 != 0) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar3 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::operator<<((ostream *)poVar3,"VertexArrayVertexBuffers has unexpectedly generated ");
      local_1f0.m_getName = glu::getErrorName;
      local_1f0.m_value = iVar5;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar3);
      std::operator<<((ostream *)poVar3,"error. Test fails.\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00b14889;
    }
  }
  (**(code **)(lVar8 + 0x610))(0);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glEnableVertexAttribArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x616);
  (**(code **)(lVar8 + 0x610))(1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glEnableVertexAttribArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x619);
  array_data_1[0] = 4;
  array_data_1[1] = 5;
  pGVar2 = &this->m_bo_array_1;
  (**(code **)(lVar8 + 0x6c8))(1,pGVar2);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x61f);
  (**(code **)(lVar8 + 0x40))(0x8892,this->m_bo_array_1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x622);
  (**(code **)(lVar8 + 0x150))(0x8892,8,array_data_1,0x88e4);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x625);
  pcVar4 = *(code **)(lVar8 + 0x1898);
  uVar7 = (**(code **)(lVar8 + 0x780))(this->m_po,"a_2");
  (*pcVar4)(uVar7,2);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glVertexAttribBinding call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x628);
  pcVar4 = *(code **)(lVar8 + 0x1950);
  uVar7 = (**(code **)(lVar8 + 0x780))(this->m_po,"a_2");
  (*pcVar4)(uVar7,1,0x1404,0);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glVertexAttribIFormat call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x62b);
  if (use_multiple_buffers_function) {
    (**(code **)(lVar8 + 0x1768))(*pGVar1,2,1,pGVar2);
    iVar5 = (**(code **)(lVar8 + 0x800))();
    if (iVar5 == 0) {
LAB_00b148a5:
      (**(code **)(lVar8 + 0x610))(2);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glEnableVertexAttribArray call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x64e);
      (**(code **)(lVar8 + 0xd8))(0);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glBindVertexArray call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x651);
      return true;
    }
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,"VertexArrayVertexBuffers has unexpectedly generated ");
    local_1f0.m_getName = glu::getErrorName;
    local_1f0.m_value = iVar5;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar3);
    std::operator<<((ostream *)poVar3,"error. Test fails.\n");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    (**(code **)(lVar8 + 0x1760))(*pGVar1,2,*pGVar2,0,4);
    local_1f0.m_value = (**(code **)(lVar8 + 0x800))();
    if (local_1f0.m_value == 0) goto LAB_00b148a5;
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,"VertexArrayVertexBuffer has unexpectedly generated ");
    local_1f0.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar3);
    std::operator<<((ostream *)poVar3,"error. Test fails.\n");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
LAB_00b14889:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  return false;
}

Assistant:

bool VertexBuffersTest::PrepareVAO(bool use_multiple_buffers_function)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* VAO creation. */
	gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Array buffer 0 creation. */
	glw::GLint array_data_0[4] = { 0, 2, 1, 3 };

	gl.genBuffers(1, &m_bo_array_0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_array_0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(array_data_0), array_data_0, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	gl.vertexAttribBinding(gl.getAttribLocation(m_po, "a_0"), 0);

	gl.vertexAttribBinding(gl.getAttribLocation(m_po, "a_1"), 1);

	gl.vertexAttribIFormat(gl.getAttribLocation(m_po, "a_0"), 1, GL_INT, 0);

	gl.vertexAttribIFormat(gl.getAttribLocation(m_po, "a_1"), 1, GL_INT, 0);

	if (use_multiple_buffers_function)
	{
		const glw::GLuint		   buffers[2] = { m_bo_array_0, m_bo_array_0 };
		static const glw::GLintptr offsets[2] = { (glw::GLintptr)NULL, (glw::GLintptr)((glw::GLint*)NULL + 1) };
		static const glw::GLsizei  strides[2] = { sizeof(glw::GLint) * 2, sizeof(glw::GLint) * 2 };

		gl.vertexArrayVertexBuffers(m_vao, 0, 2, buffers, offsets, strides);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "VertexArrayVertexBuffers has unexpectedly generated "
												<< glu::getErrorStr(error) << "error. Test fails.\n"
												<< tcu::TestLog::EndMessage;

			return false;
		}
	}
	else
	{
		gl.vertexArrayVertexBuffer(m_vao, 0, m_bo_array_0, (glw::GLintptr)NULL, sizeof(glw::GLint) * 2);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "VertexArrayVertexBuffer has unexpectedly generated "
												<< glu::getErrorStr(error) << "error. Test fails.\n"
												<< tcu::TestLog::EndMessage;

			return false;
		}

		gl.vertexArrayVertexBuffer(m_vao, 1, m_bo_array_0, (glw::GLintptr)((glw::GLint*)NULL + 1),
								   sizeof(glw::GLint) * 2);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "VertexArrayVertexBuffer has unexpectedly generated "
												<< glu::getErrorStr(error) << "error. Test fails.\n"
												<< tcu::TestLog::EndMessage;

			return false;
		}
	}

	gl.enableVertexAttribArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.enableVertexAttribArray(1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	/* Array buffer 1 creation. */
	glw::GLint array_data_1[2] = { 4, 5 };

	gl.genBuffers(1, &m_bo_array_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_array_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(array_data_1), array_data_1, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	gl.vertexAttribBinding(gl.getAttribLocation(m_po, "a_2"), 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribBinding call failed.");

	gl.vertexAttribIFormat(gl.getAttribLocation(m_po, "a_2"), 1, GL_INT, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribIFormat call failed.");

	if (use_multiple_buffers_function)
	{
		glw::GLintptr offset = (glw::GLintptr)NULL;
		glw::GLsizei  stride = sizeof(glw::GLint);

		gl.vertexArrayVertexBuffers(m_vao, 2, 1, &m_bo_array_1, &offset, &stride);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "VertexArrayVertexBuffers has unexpectedly generated "
												<< glu::getErrorStr(error) << "error. Test fails.\n"
												<< tcu::TestLog::EndMessage;

			return false;
		}
	}
	else
	{
		gl.vertexArrayVertexBuffer(m_vao, 2, m_bo_array_1, (glw::GLintptr)NULL, sizeof(glw::GLint));

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "VertexArrayVertexBuffer has unexpectedly generated "
												<< glu::getErrorStr(error) << "error. Test fails.\n"
												<< tcu::TestLog::EndMessage;

			return false;
		}
	}

	gl.enableVertexAttribArray(2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.bindVertexArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	return true;
}